

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O1

FT_Error raccess_guess_darwin_newvfs
                   (FT_Library library,FT_Stream stream,char *base_file_name,char **result_file_name
                   ,FT_Long *result_offset)

{
  size_t __n;
  size_t __n_00;
  char *__s;
  int iVar1;
  
  __n_00 = strlen(base_file_name);
  iVar1 = 10;
  if ((long)__n_00 < 0x7fffffee) {
    __n = __n_00 + 0x12;
    if ((long)__n_00 < -0x11) {
      __s = (char *)0x0;
      iVar1 = 6;
      if (__n == 0) {
        iVar1 = 0;
      }
    }
    else {
      __s = (char *)(*library->memory->alloc)(library->memory,__n);
      iVar1 = (uint)(__s == (char *)0x0) << 6;
    }
    if ((-0x12 < (long)__n_00) && (iVar1 == 0)) {
      memset(__s,0,__n);
    }
    if (iVar1 == 0) {
      memcpy(__s,base_file_name,__n_00);
      builtin_strncpy(__s + __n_00,"/..namedfork/rsrc",0x12);
      *result_file_name = __s;
      *result_offset = 0;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static FT_Error
  raccess_guess_darwin_newvfs( FT_Library  library,
                               FT_Stream   stream,
                               char       *base_file_name,
                               char      **result_file_name,
                               FT_Long    *result_offset )
  {
    /*
      Only meaningful on systems with Mac OS X (> 10.1).
     */
    FT_Error   error;
    char*      newpath = NULL;
    FT_Memory  memory;
    FT_Long    base_file_len = (FT_Long)ft_strlen( base_file_name );

    FT_UNUSED( stream );


    memory = library->memory;

    if ( base_file_len + 18 > FT_INT_MAX )
      return FT_THROW( Array_Too_Large );

    if ( FT_ALLOC( newpath, base_file_len + 18 ) )
      return error;

    FT_MEM_COPY( newpath, base_file_name, base_file_len );
    FT_MEM_COPY( newpath + base_file_len, "/..namedfork/rsrc", 18 );

    *result_file_name = newpath;
    *result_offset    = 0;

    return FT_Err_Ok;
  }